

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

bool __thiscall Parser::LabelExists(Parser *this,IdentPtr pid,LabelId *pLabelIdList)

{
  StmtNest *pStmt;
  long *plVar1;
  long *plVar2;
  bool bVar3;
  long local_20;
  StmtNest dummy;
  
  plVar2 = &local_20;
  dummy.field_0 = (anon_union_8_2_ecfd7102_for_StmtNest_0)pLabelIdList;
  dummy.pLabelId = (LabelId *)this->m_pstmtCur;
  bVar3 = true;
  plVar1 = plVar2;
  do {
    while (plVar2 = (long *)plVar2[1], plVar2 == (long *)0x0) {
      plVar2 = (long *)plVar1[2];
      bVar3 = plVar2 != (long *)0x0;
      plVar1 = plVar2;
      if (!bVar3) {
        return bVar3;
      }
    }
  } while ((IdentPtr)*plVar2 != pid);
  return bVar3;
}

Assistant:

bool Parser::LabelExists(IdentPtr pid, LabelId* pLabelIdList)
{
    StmtNest dummy;
    dummy.pLabelId = pLabelIdList;
    dummy.pstmtOuter = m_pstmtCur;

    // Look through each label list for the current stack of statements
    for (StmtNest* pStmt = &dummy; pStmt != nullptr; pStmt = pStmt->pstmtOuter)
    {
        for (LabelId* pLabelId = pStmt->pLabelId; pLabelId != nullptr; pLabelId = pLabelId->next)
        {
            if (pLabelId->pid == pid)
                return true;
        }
    }

    return false;
}